

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void close_all_listening_sockets(mg_context *ctx)

{
  long lVar1;
  ulong uVar2;
  
  if (ctx->num_listening_sockets != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      close(*(int *)((long)&ctx->listening_sockets->sock + lVar1));
      *(undefined4 *)((long)&ctx->listening_sockets->sock + lVar1) = 0xffffffff;
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x40;
    } while (uVar2 < ctx->num_listening_sockets);
  }
  free(ctx->listening_sockets);
  ctx->listening_sockets = (socket *)0x0;
  free(ctx->listening_socket_fds);
  ctx->listening_socket_fds = (pollfd *)0x0;
  return;
}

Assistant:

static void
close_all_listening_sockets(struct mg_context *ctx)
{
	unsigned int i;
	if (!ctx) {
		return;
	}

	for (i = 0; i < ctx->num_listening_sockets; i++) {
		closesocket(ctx->listening_sockets[i].sock);
#if defined(USE_X_DOM_SOCKET)
		/* For unix domain sockets, the socket name represents a file that has
		 * to be deleted. */
		/* See
		 * https://stackoverflow.com/questions/15716302/so-reuseaddr-and-af-unix
		 */
		if ((ctx->listening_sockets[i].lsa.sin.sin_family == AF_UNIX)
		    && (ctx->listening_sockets[i].sock != INVALID_SOCKET)) {
			IGNORE_UNUSED_RESULT(
			    remove(ctx->listening_sockets[i].lsa.sun.sun_path));
		}
#endif
		ctx->listening_sockets[i].sock = INVALID_SOCKET;
	}
	mg_free(ctx->listening_sockets);
	ctx->listening_sockets = NULL;
	mg_free(ctx->listening_socket_fds);
	ctx->listening_socket_fds = NULL;
}